

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O0

bool __thiscall crnlib::corpus_tester::test(corpus_tester *this,char *pCmd_line)

{
  uint uVar1;
  find_files *pfVar2;
  bool bVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  uint grayscale_comp_index;
  uint uVar6;
  param_map_const_iterator pFilename;
  param_map_const_iterator img_00;
  pointer ppVar7;
  file_desc_vec *this_00;
  char *pcVar8;
  color_quad<unsigned_char,_int> *pcVar9;
  corpus_tester *this_01;
  image_u8 *stats;
  mip_level *pmVar10;
  undefined8 in_RSI;
  bool in_stack_000001e7;
  uint in_stack_000001e8;
  uint in_stack_000001ec;
  error_metrics em;
  error_metrics em2;
  error_metrics em1;
  uint bx;
  uint by;
  vector<crnlib::image_utils::error_metrics> metrics [2];
  uint num_blocks_y;
  uint num_blocks_x;
  image_u8 *pImg2;
  image_u8 *pImg1;
  image_u8 *pOrig;
  image_u8 img2;
  image_u8 img1;
  image_u8 orig_img;
  uint l;
  image_u8 hybrid_img;
  double time2;
  mipmapped_texture tex2;
  double time1;
  timer t;
  pack_params convert_params;
  mipmapped_texture tex1;
  generate_mipmap_params genmip_params;
  mipmapped_texture orig_tex;
  uint x;
  uint y;
  image_u8 img;
  file_desc *file_desc;
  uint file_index;
  bool perceptual;
  uint num_channels;
  uint first_channel;
  image_u8 b;
  image_u8 a;
  image_u8 o;
  file_desc_vec *files;
  find_files file_finder;
  dynamic_string *filespec;
  uint in_value_index;
  param_map_const_iterator it;
  double total_time2;
  double total_time1;
  command_line_params cmd_line_params;
  uint in_stack_fffffffffffff978;
  uint in_stack_fffffffffffff97c;
  orientation_flags_t in_stack_fffffffffffff980;
  orientation_flags_t in_stack_fffffffffffff984;
  undefined4 in_stack_fffffffffffff988;
  uint in_stack_fffffffffffff98c;
  mipmapped_texture *in_stack_fffffffffffff990;
  mipmapped_texture *in_stack_fffffffffffff998;
  mipmapped_texture *in_stack_fffffffffffff9a0;
  uint in_stack_fffffffffffff9a8;
  uint in_stack_fffffffffffff9ac;
  undefined4 in_stack_fffffffffffff9b0;
  uint in_stack_fffffffffffff9b4;
  uint in_stack_fffffffffffff9b8;
  uint in_stack_fffffffffffff9bc;
  int in_stack_fffffffffffff9c0;
  int in_stack_fffffffffffff9c4;
  undefined4 in_stack_fffffffffffff9c8;
  uint in_stack_fffffffffffff9cc;
  char *in_stack_fffffffffffff9d0;
  command_line_params *in_stack_fffffffffffff9d8;
  pack_params *in_stack_fffffffffffff9e8;
  image_u8 *in_stack_fffffffffffff9f0;
  mipmapped_texture *in_stack_fffffffffffff9f8;
  find_files *in_stack_fffffffffffffa00;
  find_files *in_stack_fffffffffffffa08;
  find_files *local_5e8;
  int local_578;
  generate_mipmap_params *in_stack_fffffffffffffb10;
  undefined6 in_stack_fffffffffffffb18;
  uint in_stack_fffffffffffffb3c;
  uint in_stack_fffffffffffffb90;
  uint in_stack_fffffffffffffb94;
  vector<crnlib::image_utils::error_metrics> *in_stack_fffffffffffffb98;
  vector<crnlib::image_utils::error_metrics> *in_stack_fffffffffffffba0;
  command_line_params *in_stack_fffffffffffffba8;
  corpus_tester *in_stack_fffffffffffffbb0;
  double local_428;
  uint local_420;
  uint local_41c;
  undefined1 local_418 [40];
  uint local_3f0;
  uint local_3ec;
  image_u8 *local_3e8;
  image_u8 *local_3e0;
  image_u8 *local_3d8;
  uint local_340;
  double local_308;
  double local_2b8;
  int local_294;
  undefined4 local_290;
  undefined4 local_28c;
  byte local_288;
  undefined1 local_284;
  code *local_280;
  undefined1 local_20f;
  uint local_1b0;
  uint local_1ac;
  image<crnlib::color_quad<unsigned_char,_int>_> local_1a8;
  file_desc *local_178;
  uint local_16c;
  byte local_165;
  undefined4 local_164;
  undefined4 local_160;
  image<crnlib::color_quad<unsigned_char,_int>_> local_158;
  image<crnlib::color_quad<unsigned_char,_int>_> local_120;
  image<crnlib::color_quad<unsigned_char,_int>_> local_e8;
  file_desc_vec *local_b8;
  find_files local_b0;
  dynamic_string *local_98;
  uint local_8c;
  _Self local_88;
  _Self local_80;
  double local_78;
  double local_70;
  orientation_flags_t local_68;
  byte local_1;
  
  console::printf("Command line:\n\"%s\"",in_RSI);
  command_line_params::command_line_params
            ((command_line_params *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
  bVar3 = command_line_params::parse
                    (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc,
                     (param_desc *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                     SUB41(in_stack_fffffffffffff9bc >> 0x18,0));
  if (bVar3) {
    local_70 = 0.0;
    local_78 = 0.0;
    pFilename = command_line_params::begin
                          ((command_line_params *)
                           CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
    local_5e8 = in_stack_fffffffffffffa00;
    local_80._M_node = pFilename._M_node;
    while( true ) {
      img_00 = command_line_params::end
                         ((command_line_params *)
                          CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
      local_88._M_node = img_00._M_node;
      bVar3 = std::operator!=(&local_80,&local_88);
      if (!bVar3) break;
      std::
      _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                    *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
      bVar3 = dynamic_string::operator!=
                        ((dynamic_string *)
                         CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                         (char *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
      in_stack_fffffffffffffb3c = CONCAT13(bVar3,(int3)in_stack_fffffffffffffb3c);
      if (!bVar3) {
        ppVar7 = std::
                 _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                               *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
        bVar3 = vector<crnlib::dynamic_string>::empty(&(ppVar7->second).m_values);
        in_stack_fffffffffffffb3c =
             CONCAT13((char)(in_stack_fffffffffffffb3c >> 0x18),
                      CONCAT12(bVar3,(short)in_stack_fffffffffffffb3c));
        if (bVar3) {
          console::error("Must follow /in parameter with a filename!\n");
          local_1 = 0;
          local_68 = cOrientationFlagXFlipped;
          goto LAB_0010d155;
        }
        local_8c = 0;
        while( true ) {
          uVar1 = local_8c;
          ppVar7 = std::
                   _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                   ::operator->((_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                                 *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
          grayscale_comp_index = vector<crnlib::dynamic_string>::size(&(ppVar7->second).m_values);
          if (grayscale_comp_index <= uVar1) break;
          ppVar7 = std::
                   _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                   ::operator->((_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                                 *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
          local_98 = vector<crnlib::dynamic_string>::operator[](&(ppVar7->second).m_values,local_8c)
          ;
          find_files::find_files
                    ((find_files *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
          dynamic_string::get_ptr(local_98);
          uVar4 = command_line_params::has_key
                            ((command_line_params *)in_stack_fffffffffffff990,
                             (char *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
          uVar5 = find_files::find(in_stack_fffffffffffffa08,(char *)local_5e8,
                                   (uint)((ulong)in_stack_fffffffffffff9f8 >> 0x20));
          if ((bool)uVar5) {
            this_00 = find_files::get_files(&local_b0);
            bVar3 = vector<crnlib::find_files::file_desc>::empty(this_00);
            if (bVar3) {
              pcVar8 = dynamic_string::get_ptr(local_98);
              console::warning("No files found: %s",pcVar8);
              local_1 = 0;
              local_68 = cOrientationFlagXFlipped;
            }
            else {
              local_b8 = find_files::get_files(&local_b0);
              color_quad<unsigned_char,_int>::make_black();
              image<crnlib::color_quad<unsigned_char,_int>_>::image
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                         CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                         in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8,
                         in_stack_fffffffffffff9b4,
                         (color_quad<unsigned_char,_int> *)
                         CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                         (uint)((ulong)in_stack_fffffffffffff9a0 >> 0x20));
              color_quad<unsigned_char,_int>::make_black();
              image<crnlib::color_quad<unsigned_char,_int>_>::image
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                         CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                         in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8,
                         in_stack_fffffffffffff9b4,
                         (color_quad<unsigned_char,_int> *)
                         CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                         (uint)((ulong)in_stack_fffffffffffff9a0 >> 0x20));
              color_quad<unsigned_char,_int>::make_black();
              image<crnlib::color_quad<unsigned_char,_int>_>::image
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                         CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                         in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8,
                         in_stack_fffffffffffff9b4,
                         (color_quad<unsigned_char,_int> *)
                         CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                         (uint)((ulong)in_stack_fffffffffffff9a0 >> 0x20));
              local_160 = 0;
              local_164 = 3;
              local_165 = command_line_params::get_value_as_bool
                                    ((command_line_params *)in_stack_fffffffffffff998,
                                     (char *)in_stack_fffffffffffff990,in_stack_fffffffffffff98c,
                                     SUB41((uint)in_stack_fffffffffffff988 >> 0x18,0));
              if ((bool)local_165) {
                local_160 = 0;
                local_164 = 0;
              }
              console::printf("Perceptual mode: %u",(ulong)local_165);
              for (local_16c = 0; uVar1 = local_16c,
                  uVar6 = vector<crnlib::find_files::file_desc>::size(local_b8), uVar1 < uVar6;
                  local_16c = local_16c + 1) {
                local_178 = vector<crnlib::find_files::file_desc>::operator[](local_b8,local_16c);
                pcVar8 = dynamic_string::get_ptr(&local_178->m_fullname);
                console::printf("-------- Loading image: %s",pcVar8);
                image<crnlib::color_quad<unsigned_char,_int>_>::image
                          ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x10c051);
                dynamic_string::get_ptr(&local_178->m_fullname);
                bVar3 = image_utils::read_from_file
                                  ((image_u8 *)in_stack_fffffffffffff9f8,
                                   (char *)in_stack_fffffffffffff9f0,
                                   (uint)((ulong)in_stack_fffffffffffff9e8 >> 0x20));
                if (bVar3) {
                  bVar3 = command_line_params::has_key
                                    ((command_line_params *)in_stack_fffffffffffff990,
                                     (char *)CONCAT44(in_stack_fffffffffffff98c,
                                                      in_stack_fffffffffffff988));
                  if ((!bVar3) &&
                     (bVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::is_component_valid
                                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                                         CONCAT44(in_stack_fffffffffffff984,
                                                  in_stack_fffffffffffff980),
                                         in_stack_fffffffffffff97c), bVar3)) {
                    for (local_1ac = 0; uVar1 = local_1ac,
                        uVar6 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height
                                          (&local_1a8), uVar1 < uVar6; local_1ac = local_1ac + 1) {
                      for (local_1b0 = 0; uVar1 = local_1b0,
                          uVar6 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width
                                            (&local_1a8), uVar1 < uVar6; local_1b0 = local_1b0 + 1)
                      {
                        pcVar9 = image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                                           (&local_1a8,local_1b0,local_1ac);
                        (pcVar9->field_0).field_0.a = 0xff;
                      }
                    }
                    image<crnlib::color_quad<unsigned_char,_int>_>::set_component_valid
                              ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                               CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                               in_stack_fffffffffffff97c,SUB41(in_stack_fffffffffffff978 >> 0x18,0))
                    ;
                  }
                  mipmapped_texture::mipmapped_texture(in_stack_fffffffffffff9a0);
                  crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>,crnlib::image<crnlib::color_quad<unsigned_char,int>>>
                            ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                             CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
                  mipmapped_texture::assign
                            (in_stack_fffffffffffff990,
                             (image_u8 *)
                             CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                             in_stack_fffffffffffff984,in_stack_fffffffffffff980);
                  bVar3 = command_line_params::has_key
                                    ((command_line_params *)in_stack_fffffffffffff990,
                                     (char *)CONCAT44(in_stack_fffffffffffff98c,
                                                      in_stack_fffffffffffff988));
                  if (bVar3) {
LAB_0010c348:
                    console::printf("Compress 1");
                    mipmapped_texture::mipmapped_texture
                              ((mipmapped_texture *)
                               CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                               (mipmapped_texture *)
                               CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
                    dxt_image::pack_params::pack_params((pack_params *)0x10c37c);
                    local_284 = command_line_params::get_value_as_bool
                                          ((command_line_params *)in_stack_fffffffffffff998,
                                           (char *)in_stack_fffffffffffff990,
                                           in_stack_fffffffffffff98c,
                                           SUB41((uint)in_stack_fffffffffffff988 >> 0x18,0));
                    local_28c = 0;
                    local_290 = 2;
                    local_288 = local_165 & 1;
                    bVar3 = command_line_params::get_value_as_bool
                                      ((command_line_params *)in_stack_fffffffffffff998,
                                       (char *)in_stack_fffffffffffff990,in_stack_fffffffffffff98c,
                                       SUB41((uint)in_stack_fffffffffffff988 >> 0x18,0));
                    if (bVar3) {
                      local_578 = g_number_of_processors + -1;
                    }
                    else {
                      local_578 = 0;
                    }
                    local_294 = local_578;
                    local_280 = progress_callback;
                    timer::timer((timer *)0x10c450);
                    timer::start((timer *)CONCAT44(in_stack_fffffffffffff984,
                                                   in_stack_fffffffffffff980));
                    bVar3 = mipmapped_texture::convert
                                      (in_stack_fffffffffffff9f8,
                                       (pixel_format)((ulong)in_stack_fffffffffffff9f0 >> 0x20),
                                       SUB81((ulong)in_stack_fffffffffffff9f0 >> 0x18,0),
                                       in_stack_fffffffffffff9e8);
                    if (bVar3) {
                      local_2b8 = timer::get_elapsed_secs
                                            ((timer *)CONCAT44(in_stack_fffffffffffff98c,
                                                               in_stack_fffffffffffff988));
                      local_70 = local_70 + local_2b8;
                      console::printf("Elapsed time: %3.3f",local_2b8);
                      console::printf("Compress 2");
                      mipmapped_texture::mipmapped_texture
                                ((mipmapped_texture *)
                                 CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                                 (mipmapped_texture *)
                                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
                      local_284 = 0;
                      local_28c = 0;
                      local_290 = 0;
                      timer::start((timer *)CONCAT44(in_stack_fffffffffffff984,
                                                     in_stack_fffffffffffff980));
                      bVar3 = mipmapped_texture::convert
                                        (in_stack_fffffffffffff9f8,
                                         (pixel_format)((ulong)in_stack_fffffffffffff9f0 >> 0x20),
                                         SUB81((ulong)in_stack_fffffffffffff9f0 >> 0x18,0),
                                         in_stack_fffffffffffff9e8);
                      if (bVar3) {
                        local_308 = timer::get_elapsed_secs
                                              ((timer *)CONCAT44(in_stack_fffffffffffff98c,
                                                                 in_stack_fffffffffffff988));
                        local_78 = local_78 + local_308;
                        console::printf("Elapsed time: %3.3f",local_308);
                        image<crnlib::color_quad<unsigned_char,_int>_>::get_width(&local_1a8);
                        image<crnlib::color_quad<unsigned_char,_int>_>::get_height(&local_1a8);
                        color_quad<unsigned_char,_int>::make_black();
                        image<crnlib::color_quad<unsigned_char,_int>_>::image
                                  ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                                   CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                                   in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8,
                                   in_stack_fffffffffffff9b4,
                                   (color_quad<unsigned_char,_int> *)
                                   CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                                   (uint)((ulong)in_stack_fffffffffffff9a0 >> 0x20));
                        for (local_340 = 0; uVar1 = local_340,
                            uVar6 = mipmapped_texture::get_num_levels
                                              ((mipmapped_texture *)
                                               CONCAT44(in_stack_fffffffffffff97c,
                                                        in_stack_fffffffffffff978)), uVar1 < uVar6;
                            local_340 = local_340 + 1) {
                          image<crnlib::color_quad<unsigned_char,_int>_>::image
                                    ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x10c71c);
                          image<crnlib::color_quad<unsigned_char,_int>_>::image
                                    ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x10c72b);
                          image<crnlib::color_quad<unsigned_char,_int>_>::image
                                    ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x10c73a);
                          mipmapped_texture::get_level
                                    ((mipmapped_texture *)
                                     CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                                     in_stack_fffffffffffff97c,in_stack_fffffffffffff978);
                          local_3d8 = mip_level::get_unpacked_image
                                                ((mip_level *)
                                                 CONCAT44(in_stack_fffffffffffff98c,
                                                          in_stack_fffffffffffff988),
                                                 (image_u8 *)
                                                 CONCAT44(in_stack_fffffffffffff984,
                                                          in_stack_fffffffffffff980),
                                                 in_stack_fffffffffffff97c);
                          this_01 = (corpus_tester *)
                                    mipmapped_texture::get_level
                                              ((mipmapped_texture *)
                                               CONCAT44(in_stack_fffffffffffff984,
                                                        in_stack_fffffffffffff980),
                                               in_stack_fffffffffffff97c,in_stack_fffffffffffff978);
                          stats = mip_level::get_unpacked_image
                                            ((mip_level *)
                                             CONCAT44(in_stack_fffffffffffff98c,
                                                      in_stack_fffffffffffff988),
                                             (image_u8 *)
                                             CONCAT44(in_stack_fffffffffffff984,
                                                      in_stack_fffffffffffff980),
                                             in_stack_fffffffffffff97c);
                          local_3e0 = stats;
                          pmVar10 = mipmapped_texture::get_level
                                              ((mipmapped_texture *)
                                               CONCAT44(in_stack_fffffffffffff984,
                                                        in_stack_fffffffffffff980),
                                               in_stack_fffffffffffff97c,in_stack_fffffffffffff978);
                          local_3e8 = mip_level::get_unpacked_image
                                                ((mip_level *)
                                                 CONCAT44(in_stack_fffffffffffff98c,
                                                          in_stack_fffffffffffff988),
                                                 (image_u8 *)
                                                 CONCAT44(in_stack_fffffffffffff984,
                                                          in_stack_fffffffffffff980),
                                                 in_stack_fffffffffffff97c);
                          local_3ec = image<crnlib::color_quad<unsigned_char,_int>_>::
                                      get_block_width(local_3d8,4);
                          local_3f0 = image<crnlib::color_quad<unsigned_char,_int>_>::
                                      get_block_height(local_3d8,4);
                          in_stack_fffffffffffffa08 = (find_files *)local_418;
                          pfVar2 = in_stack_fffffffffffffa08;
                          do {
                            local_5e8 = pfVar2;
                            vector<crnlib::image_utils::error_metrics>::vector
                                      ((vector<crnlib::image_utils::error_metrics> *)local_5e8);
                            pfVar2 = (find_files *)&local_5e8->m_last_error;
                          } while (&local_5e8->m_last_error != (int64 *)(local_418 + 0x20));
                          for (local_41c = 0; local_41c < local_3f0; local_41c = local_41c + 1) {
                            for (local_420 = 0; local_420 < local_3ec; local_420 = local_420 + 1) {
                              in_stack_fffffffffffff9f0 = local_3d8;
                              in_stack_fffffffffffff9f8 =
                                   (mipmapped_texture *)
                                   image<crnlib::color_quad<unsigned_char,_int>_>::get_ptr
                                             (&local_e8);
                              image<crnlib::color_quad<unsigned_char,_int>_>::extract_block
                                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                                         CONCAT44(in_stack_fffffffffffff9bc,
                                                  in_stack_fffffffffffff9b8),
                                         (color_quad<unsigned_char,_int> *)
                                         CONCAT44(in_stack_fffffffffffff9b4,
                                                  in_stack_fffffffffffff9b0),
                                         in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8,
                                         (uint)((ulong)in_stack_fffffffffffff9a0 >> 0x20),
                                         (uint)in_stack_fffffffffffff9a0,
                                         SUB81((ulong)in_stack_fffffffffffff998 >> 0x38,0));
                              in_stack_fffffffffffff9e8 =
                                   (pack_params *)
                                   image<crnlib::color_quad<unsigned_char,_int>_>::get_ptr
                                             (&local_120);
                              image<crnlib::color_quad<unsigned_char,_int>_>::extract_block
                                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                                         CONCAT44(in_stack_fffffffffffff9bc,
                                                  in_stack_fffffffffffff9b8),
                                         (color_quad<unsigned_char,_int> *)
                                         CONCAT44(in_stack_fffffffffffff9b4,
                                                  in_stack_fffffffffffff9b0),
                                         in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8,
                                         (uint)((ulong)in_stack_fffffffffffff9a0 >> 0x20),
                                         (uint)in_stack_fffffffffffff9a0,
                                         SUB81((ulong)in_stack_fffffffffffff998 >> 0x38,0));
                              image<crnlib::color_quad<unsigned_char,_int>_>::get_ptr(&local_158);
                              in_stack_fffffffffffff978 = 0;
                              image<crnlib::color_quad<unsigned_char,_int>_>::extract_block
                                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                                         CONCAT44(in_stack_fffffffffffff9bc,
                                                  in_stack_fffffffffffff9b8),
                                         (color_quad<unsigned_char,_int> *)
                                         CONCAT44(in_stack_fffffffffffff9b4,
                                                  in_stack_fffffffffffff9b0),
                                         in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8,
                                         (uint)((ulong)in_stack_fffffffffffff9a0 >> 0x20),
                                         (uint)in_stack_fffffffffffff9a0,
                                         SUB81((ulong)in_stack_fffffffffffff998 >> 0x38,0));
                              image_utils::error_metrics::error_metrics((error_metrics *)0x10ca42);
                              image_utils::error_metrics::compute
                                        ((error_metrics *)em.mMeanSquared,(image_u8 *)em.mMean,
                                         (image_u8 *)em._0_8_,in_stack_000001ec,in_stack_000001e8,
                                         in_stack_000001e7);
                              image_utils::error_metrics::error_metrics((error_metrics *)0x10ca85);
                              image_utils::error_metrics::compute
                                        ((error_metrics *)em.mMeanSquared,(image_u8 *)em.mMean,
                                         (image_u8 *)em._0_8_,in_stack_000001ec,in_stack_000001e8,
                                         in_stack_000001e7);
                              vector<crnlib::image_utils::error_metrics>::push_back
                                        ((vector<crnlib::image_utils::error_metrics> *)
                                         CONCAT44(in_stack_fffffffffffff984,
                                                  in_stack_fffffffffffff980),
                                         (error_metrics *)
                                         CONCAT44(in_stack_fffffffffffff97c,
                                                  in_stack_fffffffffffff978));
                              vector<crnlib::image_utils::error_metrics>::push_back
                                        ((vector<crnlib::image_utils::error_metrics> *)
                                         CONCAT44(in_stack_fffffffffffff984,
                                                  in_stack_fffffffffffff980),
                                         (error_metrics *)
                                         CONCAT44(in_stack_fffffffffffff97c,
                                                  in_stack_fffffffffffff978));
                              if ((double)in_stack_fffffffffffffbb0 <= local_428) {
                                image<crnlib::color_quad<unsigned_char,_int>_>::blit
                                          ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                                           CONCAT44(in_stack_fffffffffffff9cc,
                                                    in_stack_fffffffffffff9c8),
                                           in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0,
                                           (image<crnlib::color_quad<unsigned_char,_int>_> *)
                                           CONCAT44(in_stack_fffffffffffff9bc,
                                                    in_stack_fffffffffffff9b8));
                              }
                              else {
                                add_bad_block((corpus_tester *)in_stack_fffffffffffff990,
                                              (image_u8 *)
                                              CONCAT44(in_stack_fffffffffffff98c,
                                                       in_stack_fffffffffffff988));
                                image<crnlib::color_quad<unsigned_char,_int>_>::blit
                                          ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                                           CONCAT44(in_stack_fffffffffffff9cc,
                                                    in_stack_fffffffffffff9c8),
                                           in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0,
                                           (image<crnlib::color_quad<unsigned_char,_int>_> *)
                                           CONCAT44(in_stack_fffffffffffff9bc,
                                                    in_stack_fffffffffffff9b8));
                              }
                            }
                          }
                          bVar3 = command_line_params::has_key
                                            ((command_line_params *)in_stack_fffffffffffff990,
                                             (char *)CONCAT44(in_stack_fffffffffffff98c,
                                                              in_stack_fffffffffffff988));
                          in_stack_fffffffffffff9ac =
                               CONCAT13(bVar3,(int3)in_stack_fffffffffffff9ac);
                          if (bVar3) {
                            image_utils::write_to_file
                                      ((char *)pFilename._M_node,(image_u8 *)img_00._M_node,
                                       in_stack_fffffffffffffb3c,grayscale_comp_index);
                          }
                          console::printf("---- Mip level: %u, Total blocks: %ux%u, %u",
                                          (ulong)local_340,(ulong)local_3ec,(ulong)local_3f0,
                                          (ulong)(local_3ec * local_3f0));
                          console::printf("Compressor 1:");
                          print_metric_stats(this_01,(vector<crnlib::image_utils::error_metrics> *)
                                                     stats,(uint)((ulong)pmVar10 >> 0x20),
                                             (uint)pmVar10);
                          console::printf("Compressor 2:");
                          print_metric_stats(this_01,(vector<crnlib::image_utils::error_metrics> *)
                                                     stats,(uint)((ulong)pmVar10 >> 0x20),
                                             (uint)pmVar10);
                          console::printf("Compressor 1 vs. 2:");
                          print_comparative_metric_stats
                                    (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                                     in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                                     in_stack_fffffffffffffb94,in_stack_fffffffffffffb90);
                          image_utils::error_metrics::error_metrics((error_metrics *)0x10cdc7);
                          image_utils::error_metrics::compute
                                    ((error_metrics *)em.mMeanSquared,(image_u8 *)em.mMean,
                                     (image_u8 *)em._0_8_,in_stack_000001ec,in_stack_000001e8,
                                     in_stack_000001e7);
                          image_utils::error_metrics::print
                                    ((error_metrics *)
                                     CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                                     (char *)CONCAT44(in_stack_fffffffffffff97c,
                                                      in_stack_fffffffffffff978));
                          image_utils::error_metrics::compute
                                    ((error_metrics *)em.mMeanSquared,(image_u8 *)em.mMean,
                                     (image_u8 *)em._0_8_,in_stack_000001ec,in_stack_000001e8,
                                     in_stack_000001e7);
                          image_utils::error_metrics::print
                                    ((error_metrics *)
                                     CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                                     (char *)CONCAT44(in_stack_fffffffffffff97c,
                                                      in_stack_fffffffffffff978));
                          image_utils::error_metrics::compute
                                    ((error_metrics *)em.mMeanSquared,(image_u8 *)em.mMean,
                                     (image_u8 *)em._0_8_,in_stack_000001ec,in_stack_000001e8,
                                     in_stack_000001e7);
                          image_utils::error_metrics::print
                                    ((error_metrics *)
                                     CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                                     (char *)CONCAT44(in_stack_fffffffffffff97c,
                                                      in_stack_fffffffffffff978));
                          in_stack_fffffffffffff998 = (mipmapped_texture *)local_418;
                          in_stack_fffffffffffff990 = (mipmapped_texture *)(local_418 + 0x20);
                          do {
                            in_stack_fffffffffffff990 =
                                 (mipmapped_texture *)&in_stack_fffffffffffff990[-1].m_last_error;
                            vector<crnlib::image_utils::error_metrics>::~vector
                                      ((vector<crnlib::image_utils::error_metrics> *)
                                       CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980)
                                      );
                          } while (in_stack_fffffffffffff990 != in_stack_fffffffffffff998);
                          in_stack_fffffffffffff9a0 = in_stack_fffffffffffff990;
                          image<crnlib::color_quad<unsigned_char,_int>_>::~image
                                    ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x10cf09);
                          image<crnlib::color_quad<unsigned_char,_int>_>::~image
                                    ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x10cf16);
                          image<crnlib::color_quad<unsigned_char,_int>_>::~image
                                    ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x10cf23);
                        }
                        image<crnlib::color_quad<unsigned_char,_int>_>::~image
                                  ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x10cf9b);
                        local_68 = cDefaultOrientationFlags;
                      }
                      else {
                        console::error("Texture conversion failed!");
                        local_1 = 0;
                        local_68 = cOrientationFlagXFlipped;
                      }
                      mipmapped_texture::~mipmapped_texture
                                ((mipmapped_texture *)
                                 CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
                    }
                    else {
                      console::error("Texture conversion failed!");
                      local_1 = 0;
                      local_68 = cOrientationFlagXFlipped;
                    }
                    mipmapped_texture::~mipmapped_texture
                              ((mipmapped_texture *)
                               CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
                  }
                  else {
                    mipmapped_texture::generate_mipmap_params::generate_mipmap_params
                              ((generate_mipmap_params *)
                               CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
                    local_20f = 1;
                    console::printf("Generating mipmaps");
                    bVar3 = mipmapped_texture::generate_mipmaps
                                      ((mipmapped_texture *)
                                       CONCAT17(uVar4,CONCAT16(uVar5,in_stack_fffffffffffffb18)),
                                       in_stack_fffffffffffffb10,SUB81((ulong)this_00 >> 0x38,0));
                    if (bVar3) goto LAB_0010c348;
                    console::error("Mipmap generation failed!");
                    local_1 = 0;
                    local_68 = cOrientationFlagXFlipped;
                  }
                  mipmapped_texture::~mipmapped_texture
                            ((mipmapped_texture *)
                             CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
                }
                else {
                  pcVar8 = dynamic_string::get_ptr(&local_178->m_fullname);
                  console::warning("Failed loading image file: %s",pcVar8);
                  local_68 = 10;
                }
                image<crnlib::color_quad<unsigned_char,_int>_>::~image
                          ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x10cfda);
                in_stack_fffffffffffff984 = local_68;
                if ((local_68 != cDefaultOrientationFlags) && (local_68 != 10)) goto LAB_0010d05c;
              }
              local_68 = cDefaultOrientationFlags;
LAB_0010d05c:
              image<crnlib::color_quad<unsigned_char,_int>_>::~image
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x10d069);
              image<crnlib::color_quad<unsigned_char,_int>_>::~image
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x10d076);
              image<crnlib::color_quad<unsigned_char,_int>_>::~image
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x10d083);
            }
          }
          else {
            in_stack_fffffffffffffb10 = (generate_mipmap_params *)dynamic_string::get_ptr(local_98);
            console::warning("Failed finding files: %s",in_stack_fffffffffffffb10);
            local_68 = 7;
          }
          find_files::~find_files((find_files *)0x10d090);
          in_stack_fffffffffffff980 = local_68;
          if ((local_68 != cDefaultOrientationFlags) && (local_68 != 7)) goto LAB_0010d155;
          local_8c = local_8c + 1;
        }
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                    *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
    }
    flush_bad_blocks((corpus_tester *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0))
    ;
    console::printf("Total times: %4.3f vs. %4.3f",local_70,local_78);
    local_1 = 1;
    local_68 = cOrientationFlagXFlipped;
  }
  else {
    local_1 = 0;
    local_68 = cOrientationFlagXFlipped;
  }
LAB_0010d155:
  command_line_params::~command_line_params
            ((command_line_params *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
  return (bool)(local_1 & 1);
}

Assistant:

bool corpus_tester::test(const char* pCmd_line) {
  console::printf("Command line:\n\"%s\"", pCmd_line);

  static const command_line_params::param_desc param_desc_array[] =
      {
          {"corpus_test", 0, false},
          {"in", 1, true},
          {"deep", 0, false},
          {"alpha", 0, false},
          {"nomips", 0, false},
          {"perceptual", 0, false},
          {"endpointcaching", 0, false},
          {"multithreaded", 0, false},
          {"writehybrid", 0, false},
          {"nobadblocks", 0, false},
      };

  command_line_params cmd_line_params;
  if (!cmd_line_params.parse(pCmd_line, CRNLIB_ARRAY_SIZE(param_desc_array), param_desc_array, true))
    return false;

  double total_time1 = 0, total_time2 = 0;

  command_line_params::param_map_const_iterator it = cmd_line_params.begin();
  for (; it != cmd_line_params.end(); ++it) {
    if (it->first != "in")
      continue;
    if (it->second.m_values.empty()) {
      console::error("Must follow /in parameter with a filename!\n");
      return false;
    }

    for (uint in_value_index = 0; in_value_index < it->second.m_values.size(); in_value_index++) {
      const dynamic_string& filespec = it->second.m_values[in_value_index];

      find_files file_finder;
      if (!file_finder.find(filespec.get_ptr(), find_files::cFlagAllowFiles | (cmd_line_params.has_key("deep") ? find_files::cFlagRecursive : 0))) {
        console::warning("Failed finding files: %s", filespec.get_ptr());
        continue;
      }

      if (file_finder.get_files().empty()) {
        console::warning("No files found: %s", filespec.get_ptr());
        return false;
      }

      const find_files::file_desc_vec& files = file_finder.get_files();

      image_u8 o(4, 4), a(4, 4), b(4, 4);

      uint first_channel = 0;
      uint num_channels = 3;
      bool perceptual = cmd_line_params.get_value_as_bool("perceptual", false);
      if (perceptual) {
        first_channel = 0;
        num_channels = 0;
      }
      console::printf("Perceptual mode: %u", perceptual);

      for (uint file_index = 0; file_index < files.size(); file_index++) {
        const find_files::file_desc& file_desc = files[file_index];

        console::printf("-------- Loading image: %s", file_desc.m_fullname.get_ptr());

        image_u8 img;
        if (!image_utils::read_from_file(img, file_desc.m_fullname.get_ptr(), 0)) {
          console::warning("Failed loading image file: %s", file_desc.m_fullname.get_ptr());
          continue;
        }

        if ((!cmd_line_params.has_key("alpha")) && img.is_component_valid(3)) {
          for (uint y = 0; y < img.get_height(); y++)
            for (uint x = 0; x < img.get_width(); x++)
              img(x, y).a = 255;

          img.set_component_valid(3, false);
        }

        mipmapped_texture orig_tex;
        orig_tex.assign(crnlib_new<image_u8>(img));

        if (!cmd_line_params.has_key("nomips")) {
          mipmapped_texture::generate_mipmap_params genmip_params;
          genmip_params.m_srgb = true;

          console::printf("Generating mipmaps");

          if (!orig_tex.generate_mipmaps(genmip_params, false)) {
            console::error("Mipmap generation failed!");
            return false;
          }
        }

        console::printf("Compress 1");

        mipmapped_texture tex1(orig_tex);
        dxt_image::pack_params convert_params;
        convert_params.m_endpoint_caching = cmd_line_params.get_value_as_bool("endpointcaching", 0, false);
        convert_params.m_compressor = cCRNDXTCompressorCRN;
        convert_params.m_quality = cCRNDXTQualityNormal;
        convert_params.m_perceptual = perceptual;
        convert_params.m_num_helper_threads = cmd_line_params.get_value_as_bool("multithreaded", 0, true) ? (g_number_of_processors - 1) : 0;
        convert_params.m_pProgress_callback = progress_callback;
        timer t;
        t.start();
        if (!tex1.convert(PIXEL_FMT_ETC1, false, convert_params)) {
          console::error("Texture conversion failed!");
          return false;
        }
        double time1 = t.get_elapsed_secs();
        total_time1 += time1;
        console::printf("Elapsed time: %3.3f", time1);

        console::printf("Compress 2");

        mipmapped_texture tex2(orig_tex);
        convert_params.m_endpoint_caching = false;
        convert_params.m_compressor = cCRNDXTCompressorCRN;
        convert_params.m_quality = cCRNDXTQualitySuperFast;
        t.start();
        if (!tex2.convert(PIXEL_FMT_ETC1, false, convert_params)) {
          console::error("Texture conversion failed!");
          return false;
        }
        double time2 = t.get_elapsed_secs();
        total_time2 += time2;
        console::printf("Elapsed time: %3.3f", time2);

        image_u8 hybrid_img(img.get_width(), img.get_height());

        for (uint l = 0; l < orig_tex.get_num_levels(); l++) {
          image_u8 orig_img, img1, img2;

          image_u8* pOrig = orig_tex.get_level(0, l)->get_unpacked_image(orig_img, cUnpackFlagUncook | cUnpackFlagUnflip);
          image_u8* pImg1 = tex1.get_level(0, l)->get_unpacked_image(img1, cUnpackFlagUncook | cUnpackFlagUnflip);
          image_u8* pImg2 = tex2.get_level(0, l)->get_unpacked_image(img2, cUnpackFlagUncook | cUnpackFlagUnflip);

          const uint num_blocks_x = pOrig->get_block_width(4);
          const uint num_blocks_y = pOrig->get_block_height(4);

          crnlib::vector<image_utils::error_metrics> metrics[2];

          for (uint by = 0; by < num_blocks_y; by++) {
            for (uint bx = 0; bx < num_blocks_x; bx++) {
              pOrig->extract_block(o.get_ptr(), bx * 4, by * 4, 4, 4);
              pImg1->extract_block(a.get_ptr(), bx * 4, by * 4, 4, 4);
              pImg2->extract_block(b.get_ptr(), bx * 4, by * 4, 4, 4);

              image_utils::error_metrics em1;
              em1.compute(o, a, first_channel, num_channels);

              image_utils::error_metrics em2;
              em2.compute(o, b, first_channel, num_channels);

              metrics[0].push_back(em1);
              metrics[1].push_back(em2);

              if (em1.mPeakSNR < em2.mPeakSNR) {
                add_bad_block(o);

                hybrid_img.blit(bx * 4, by * 4, b);
              } else {
                hybrid_img.blit(bx * 4, by * 4, a);
              }
            }
          }

          if (cmd_line_params.has_key("writehybrid"))
            image_utils::write_to_file("hybrid.tga", hybrid_img, image_utils::cWriteFlagIgnoreAlpha);

          console::printf("---- Mip level: %u, Total blocks: %ux%u, %u", l, num_blocks_x, num_blocks_y, num_blocks_x * num_blocks_y);

          console::printf("Compressor 1:");
          print_metric_stats(metrics[0], num_blocks_x, num_blocks_y);

          console::printf("Compressor 2:");
          print_metric_stats(metrics[1], num_blocks_x, num_blocks_y);

          console::printf("Compressor 1 vs. 2:");
          print_comparative_metric_stats(cmd_line_params, metrics[0], metrics[1], num_blocks_x, num_blocks_y);

          image_utils::error_metrics em;

          em.compute(*pOrig, *pImg1, 0, perceptual ? 0 : 3);
          em.print("Compressor 1: ");

          em.compute(*pOrig, *pImg2, 0, perceptual ? 0 : 3);
          em.print("Compressor 2: ");

          em.compute(*pOrig, hybrid_img, 0, perceptual ? 0 : 3);
          em.print("Best of Both: ");
        }
      }

    }  // file_index
  }

  flush_bad_blocks();

  console::printf("Total times: %4.3f vs. %4.3f", total_time1, total_time2);

  return true;
}